

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  cmValue cVar4;
  string *in_base;
  string_view value;
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  undefined1 local_88 [48];
  IncludeScope local_58;
  string local_48;
  
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CMAKE_CURRENT_LIST_FILE","");
  cVar4 = GetDefinition(this,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (cVar4.Value != (string *)0x0) {
    local_88._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CMAKE_PARENT_LIST_FILE","");
    value._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar4.Value)->_M_string_length;
    AddDefinition(this,(string *)local_88,value);
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,&this->StateSnapshot);
  in_base = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_88);
  cmsys::SystemTools::CollapseFullPath(&local_48,filename,in_base);
  IncludeScope::IncludeScope(&local_58,this,&local_48,noPolicyScope);
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = 0;
  bVar2 = cmListFile::ParseFile
                    ((cmListFile *)local_88,local_48._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (bVar2) {
    RunListFile(this,(cmListFile *)local_88,&local_48,(DeferCommands *)0x0);
    if (cmSystemTools::s_FatalErrorOccurred == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) goto LAB_0029a4ef;
    }
    local_58.ReportError = false;
  }
LAB_0029a4ef:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_88);
  IncludeScope::~IncludeScope(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  if (cmValue def = this->GetDefinition("CMAKE_CURRENT_LIST_FILE")) {
    this->AddDefinition("CMAKE_PARENT_LIST_FILE", *def);
  }
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    incScope.Quiet();
  }
  return true;
}